

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2Bug18391750(void)

{
  size_t sVar1;
  Options opt;
  char t [36];
  RE2 re;
  Options local_2c0;
  char local_2a8 [40];
  RE2 local_280;
  LogMessage local_1a0;
  
  local_2a8[0x10] = 'i';
  local_2a8[0x11] = 'i';
  local_2a8[0x12] = -0x19;
  local_2a8[0x13] = ')';
  local_2a8[0x14] = '{';
  local_2a8[0x15] = '7';
  local_2a8[0x16] = '1';
  local_2a8[0x17] = '1';
  local_2a8[0x18] = '}';
  local_2a8[0x19] = -0x52;
  local_2a8[0x1a] = '|';
  local_2a8[0x1b] = '|';
  local_2a8[0x1c] = -0xd;
  local_2a8[0x1d] = ')';
  local_2a8[0x1e] = -0x52;
  local_2a8[0x1f] = -0x52;
  local_2a8[0] = '(';
  local_2a8[1] = '(';
  local_2a8[2] = -4;
  local_2a8[3] = -4;
  local_2a8[4] = '\b';
  local_2a8[5] = '\b';
  local_2a8[6] = '&';
  local_2a8[7] = '&';
  local_2a8[8] = '(';
  local_2a8[9] = -0x3e;
  local_2a8[10] = -0x65;
  local_2a8[0xb] = -0x3b;
  local_2a8[0xc] = -0x3b;
  local_2a8[0xd] = -0x2c;
  local_2a8[0xe] = -0x71;
  local_2a8[0xf] = -0x71;
  local_2a8[0x20] = '.';
  local_2a8[0x21] = '*';
  local_2a8[0x22] = ')';
  local_2a8[0x23] = '\0';
  local_2c0.posix_syntax_ = false;
  local_2c0.max_mem_ = 0x800000;
  local_2c0.encoding_ = EncodingLatin1;
  local_2c0.longest_match_ = true;
  local_2c0.log_errors_ = true;
  local_2c0.literal_ = false;
  local_2c0.never_nl_ = false;
  local_2c0.dot_nl_ = true;
  local_2c0.never_capture_ = false;
  local_2c0.case_sensitive_ = false;
  local_2c0.perl_classes_ = false;
  local_2c0.word_boundary_ = false;
  local_2c0.one_line_ = false;
  local_1a0._0_8_ = local_2a8;
  sVar1 = strlen(local_2a8);
  local_1a0._8_4_ = SUB84(sVar1,0);
  RE2::RE2(&local_280,(StringPiece *)&local_1a0,&local_2c0);
  if (local_280.error_code_ != NoError) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5f8,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1a0 + 8),"Check failed: re.ok()",0x15);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  sVar1 = strlen(local_2a8);
  local_1a0._8_4_ = SUB84(sVar1,0);
  local_1a0._0_8_ = local_2a8;
  RE2::PartialMatchN((StringPiece *)&local_1a0,&local_280,(Arg **)0x0,0);
  RE2::~RE2(&local_280);
  return;
}

Assistant:

TEST(RE2, Bug18391750) {
  // Stray write past end of match_ in nfa.cc, caught by fuzzing + address sanitizer.
  const char t[] = {
      (char)0x28, (char)0x28, (char)0xfc, (char)0xfc, (char)0x08, (char)0x08,
      (char)0x26, (char)0x26, (char)0x28, (char)0xc2, (char)0x9b, (char)0xc5,
      (char)0xc5, (char)0xd4, (char)0x8f, (char)0x8f, (char)0x69, (char)0x69,
      (char)0xe7, (char)0x29, (char)0x7b, (char)0x37, (char)0x31, (char)0x31,
      (char)0x7d, (char)0xae, (char)0x7c, (char)0x7c, (char)0xf3, (char)0x29,
      (char)0xae, (char)0xae, (char)0x2e, (char)0x2a, (char)0x29, (char)0x00,
  };
  RE2::Options opt;
  opt.set_encoding(RE2::Options::EncodingLatin1);
  opt.set_longest_match(true);
  opt.set_dot_nl(true);
  opt.set_case_sensitive(false);
  RE2 re(t, opt);
  CHECK(re.ok());
  RE2::PartialMatch(t, re);
}